

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int nodeAcquire(Rtree *pRtree,i64 iNode,RtreeNode *pParent,RtreeNode **ppNode)

{
  sqlite3_blob **ppBlob;
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  RtreeNode *p;
  sqlite3_blob *pBlob;
  sqlite3_blob *psVar6;
  
  iVar2 = (int)((iNode & 0xffffffffU) * 0x51d07eaf >> 0x20);
  for (p = pRtree->aHash[(int)iNode + (((uint)((int)iNode - iVar2) >> 1) + iVar2 >> 6) * -0x61];
      p != (RtreeNode *)0x0; p = p->pNext) {
    if (p->iNode == iNode) {
      if ((pParent != (RtreeNode *)0x0) && (p->pParent != pParent)) {
        return 0x10b;
      }
      p->nRef = p->nRef + 1;
      goto LAB_001f7fe6;
    }
  }
  ppBlob = &pRtree->pNodeBlob;
  psVar6 = pRtree->pNodeBlob;
  if (psVar6 == (sqlite3_blob *)0x0) {
LAB_001f7f8f:
    iVar4 = 0;
    iVar2 = sqlite3_blob_open(pRtree->db,pRtree->zDb,pRtree->zNodeName,"data",iNode,0,ppBlob);
    if (iVar2 != 0) goto LAB_001f7fb9;
    psVar6 = pRtree->pNodeBlob;
    iVar2 = pRtree->iNodeSize;
    if (psVar6 != (sqlite3_blob *)0x0) goto LAB_001f7ffd;
LAB_001f800c:
    if (iVar2 == iVar4) {
      iVar3 = sqlite3_initialize();
      iVar4 = 7;
      if ((iVar3 == 0) &&
         (p = (RtreeNode *)sqlite3Malloc((long)iVar2 + 0x28), p != (RtreeNode *)0x0)) {
        p->pParent = pParent;
        p->zData = (u8 *)(p + 1);
        p->nRef = 1;
        pRtree->nNodeRef = pRtree->nNodeRef + 1;
        p->iNode = iNode;
        p->isDirty = 0;
        p->pNext = (RtreeNode *)0x0;
        iVar4 = blobReadWrite(pRtree->pNodeBlob,p + 1,pRtree->iNodeSize,0,sqlite3BtreePayloadChecked
                             );
        if ((iNode == 1) && (iVar4 == 0)) {
          uVar1 = *(ushort *)p->zData << 8 | *(ushort *)p->zData >> 8;
          pRtree->iDepth = (uint)uVar1;
          iVar4 = 0x10b;
          if (uVar1 < 0x29) {
LAB_001f80dd:
            iVar4 = 0x10b;
            if ((int)(uint)(ushort)(*(ushort *)(p->zData + 2) << 8 | *(ushort *)(p->zData + 2) >> 8)
                <= (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell) {
              if (pParent != (RtreeNode *)0x0) {
                pParent->nRef = pParent->nRef + 1;
              }
              uVar5 = (uint)p->iNode % 0x61;
              p->pNext = pRtree->aHash[uVar5];
              pRtree->aHash[uVar5] = p;
LAB_001f7fe6:
              iVar4 = 0;
              goto LAB_001f8037;
            }
          }
        }
        else if (iVar4 == 0) goto LAB_001f80dd;
        psVar6 = pRtree->pNodeBlob;
        pRtree->pNodeBlob = (sqlite3_blob *)0x0;
        sqlite3_blob_close(psVar6);
        pRtree->nNodeRef = pRtree->nNodeRef - 1;
        sqlite3_free(p);
        goto LAB_001f8034;
      }
      goto LAB_001f801e;
    }
    iVar4 = 0x10b;
  }
  else {
    *ppBlob = (sqlite3_blob *)0x0;
    iVar2 = sqlite3_blob_reopen(psVar6,iNode);
    *ppBlob = psVar6;
    if (iVar2 == 0) {
      iVar2 = pRtree->iNodeSize;
LAB_001f7ffd:
      if (*(long *)(psVar6 + 0x18) == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *(int *)psVar6;
      }
      goto LAB_001f800c;
    }
    *ppBlob = (sqlite3_blob *)0x0;
    sqlite3_blob_close(psVar6);
    if (iVar2 == 7) {
      return 7;
    }
    if (*ppBlob == (sqlite3_blob *)0x0) goto LAB_001f7f8f;
LAB_001f7fb9:
    *ppNode = (RtreeNode *)0x0;
    iVar4 = 0x10b;
    if (iVar2 != 1) {
      iVar4 = iVar2;
    }
LAB_001f801e:
    psVar6 = *ppBlob;
    *ppBlob = (sqlite3_blob *)0x0;
    sqlite3_blob_close(psVar6);
  }
LAB_001f8034:
  p = (RtreeNode *)0x0;
LAB_001f8037:
  *ppNode = p;
  return iVar4;
}

Assistant:

static int nodeAcquire(
  Rtree *pRtree,             /* R-tree structure */
  i64 iNode,                 /* Node number to load */
  RtreeNode *pParent,        /* Either the parent node or NULL */
  RtreeNode **ppNode         /* OUT: Acquired node */
){
  int rc = SQLITE_OK;
  RtreeNode *pNode = 0;

  /* Check if the requested node is already in the hash table. If so,
  ** increase its reference count and return it.
  */
  if( (pNode = nodeHashLookup(pRtree, iNode))!=0 ){
    if( pParent && ALWAYS(pParent!=pNode->pParent) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    pNode->nRef++;
    *ppNode = pNode;
    return SQLITE_OK;
  }

  if( pRtree->pNodeBlob ){
    sqlite3_blob *pBlob = pRtree->pNodeBlob;
    pRtree->pNodeBlob = 0;
    rc = sqlite3_blob_reopen(pBlob, iNode);
    pRtree->pNodeBlob = pBlob;
    if( rc ){
      nodeBlobReset(pRtree);
      if( rc==SQLITE_NOMEM ) return SQLITE_NOMEM;
    }
  }
  if( pRtree->pNodeBlob==0 ){
    rc = sqlite3_blob_open(pRtree->db, pRtree->zDb, pRtree->zNodeName,
                           "data", iNode, 0,
                           &pRtree->pNodeBlob);
  }
  if( rc ){
    *ppNode = 0;
    /* If unable to open an sqlite3_blob on the desired row, that can only
    ** be because the shadow tables hold erroneous data. */
    if( rc==SQLITE_ERROR ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }else if( pRtree->iNodeSize==sqlite3_blob_bytes(pRtree->pNodeBlob) ){
    pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode)+pRtree->iNodeSize);
    if( !pNode ){
      rc = SQLITE_NOMEM;
    }else{
      pNode->pParent = pParent;
      pNode->zData = (u8 *)&pNode[1];
      pNode->nRef = 1;
      pRtree->nNodeRef++;
      pNode->iNode = iNode;
      pNode->isDirty = 0;
      pNode->pNext = 0;
      rc = sqlite3_blob_read(pRtree->pNodeBlob, pNode->zData,
                             pRtree->iNodeSize, 0);
    }
  }

  /* If the root node was just loaded, set pRtree->iDepth to the height
  ** of the r-tree structure. A height of zero means all data is stored on
  ** the root node. A height of one means the children of the root node
  ** are the leaves, and so on. If the depth as specified on the root node
  ** is greater than RTREE_MAX_DEPTH, the r-tree structure must be corrupt.
  */
  if( rc==SQLITE_OK && pNode && iNode==1 ){
    pRtree->iDepth = readInt16(pNode->zData);
    if( pRtree->iDepth>RTREE_MAX_DEPTH ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  /* If no error has occurred so far, check if the "number of entries"
  ** field on the node is too large. If so, set the return code to
  ** SQLITE_CORRUPT_VTAB.
  */
  if( pNode && rc==SQLITE_OK ){
    if( NCELL(pNode)>((pRtree->iNodeSize-4)/pRtree->nBytesPerCell) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  if( rc==SQLITE_OK ){
    if( pNode!=0 ){
      nodeReference(pParent);
      nodeHashInsert(pRtree, pNode);
    }else{
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
    *ppNode = pNode;
  }else{
    nodeBlobReset(pRtree);
    if( pNode ){
      pRtree->nNodeRef--;
      sqlite3_free(pNode);
    }
    *ppNode = 0;
  }

  return rc;
}